

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O3

vector<std::byte,_std::allocator<std::byte>_> *
ParseHex<std::byte>(vector<std::byte,_std::allocator<std::byte>_> *__return_storage_ptr__,
                   string_view hex_str)

{
  pointer pbVar1;
  pointer pbVar2;
  byte bVar3;
  _Storage<std::vector<std::byte,_std::allocator<std::byte>_>,_false> *p_Var4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  _Storage<std::vector<std::byte,_std::allocator<std::byte>_>,_false> local_58;
  _Storage<std::vector<std::byte,_std::allocator<std::byte>_>,_false> local_38;
  byte local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  TryParseHex<std::byte>
            ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)&local_38._M_value,
             hex_str);
  bVar3 = local_20;
  local_58._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var4 = &local_58;
  if (local_20 != 0) {
    p_Var4 = &local_38;
  }
  pbVar1 = *(pointer *)
            &(((_Optional_base<std::vector<std::byte,_std::allocator<std::byte>_>,_false,_false> *)
              &(p_Var4->_M_value).super__Vector_base<std::byte,_std::allocator<std::byte>_>)->
             _M_payload).
             super__Optional_payload<std::vector<std::byte,_std::allocator<std::byte>_>,_true,_false,_false>
             .super__Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>.
             _M_payload._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl;
  pbVar2 = *(pointer *)
            ((long)&(((_Optional_base<std::vector<std::byte,_std::allocator<std::byte>_>,_false,_false>
                       *)&(p_Var4->_M_value).
                          super__Vector_base<std::byte,_std::allocator<std::byte>_>)->_M_payload).
                    super__Optional_payload<std::vector<std::byte,_std::allocator<std::byte>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>
                    ._M_payload._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                    _M_impl + 8);
  uVar5 = local_38._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  if (local_20 == 0) {
    uVar5 = (pointer)0x0;
  }
  *(pointer *)
   ((long)&(((_Optional_base<std::vector<std::byte,_std::allocator<std::byte>_>,_false,_false> *)
            &(p_Var4->_M_value).super__Vector_base<std::byte,_std::allocator<std::byte>_>)->
           _M_payload).
           super__Optional_payload<std::vector<std::byte,_std::allocator<std::byte>_>,_true,_false,_false>
           .super__Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>.
           _M_payload._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl +
   0x10) = (pointer)0x0;
  *(undefined8 *)
   &(((_Optional_base<std::vector<std::byte,_std::allocator<std::byte>_>,_false,_false> *)
     &(p_Var4->_M_value).super__Vector_base<std::byte,_std::allocator<std::byte>_>)->_M_payload).
    super__Optional_payload<std::vector<std::byte,_std::allocator<std::byte>_>,_true,_false,_false>.
    super__Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>._M_payload.
    _M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl = 0;
  *(pointer *)
   ((long)&(((_Optional_base<std::vector<std::byte,_std::allocator<std::byte>_>,_false,_false> *)
            &(p_Var4->_M_value).super__Vector_base<std::byte,_std::allocator<std::byte>_>)->
           _M_payload).
           super__Optional_payload<std::vector<std::byte,_std::allocator<std::byte>_>,_true,_false,_false>
           .super__Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>.
           _M_payload._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl + 8
   ) = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
  super__Vector_impl_data._M_start = pbVar1;
  (__return_storage_ptr__->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
  super__Vector_impl_data._M_finish = pbVar2;
  (__return_storage_ptr__->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)uVar5;
  if (local_58._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58._M_value.
                          super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage - local_58._0_8_);
    bVar3 = local_20;
  }
  if ((bVar3 & 1) != 0) {
    local_20 = 0;
    if (local_38._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38._M_value.
                            super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage - local_38._0_8_);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<Byte> ParseHex(std::string_view hex_str)
{
    return TryParseHex<Byte>(hex_str).value_or(std::vector<Byte>{});
}